

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O0

void __thiscall PrintC::emitExpression(PrintC *this,PcodeOp *op)

{
  bool bVar1;
  Varnode *pVVar2;
  PcodeOp *this_00;
  PcodeOp *newop;
  Varnode *outvn;
  PcodeOp *op_local;
  PrintC *this_local;
  
  pVVar2 = PcodeOp::getOut(op);
  if (pVVar2 == (Varnode *)0x0) {
    bVar1 = PcodeOp::doesSpecialPrinting(op);
    if (bVar1) {
      pVVar2 = PcodeOp::getIn(op,1);
      this_00 = Varnode::getDef(pVVar2);
      pVVar2 = PcodeOp::getOut(this_00);
      PrintLanguage::pushOp(&this->super_PrintLanguage,&assignment,this_00);
      PrintLanguage::pushVnLHS(&this->super_PrintLanguage,pVVar2,this_00);
      (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x2f])(this,op,1);
      PrintLanguage::recurse(&this->super_PrintLanguage);
      return;
    }
  }
  else {
    if ((((this->super_PrintLanguage).field_0xfd & 1) != 0) &&
       (bVar1 = emitInplaceOp(this,op), bVar1)) {
      return;
    }
    PrintLanguage::pushOp(&this->super_PrintLanguage,&assignment,op);
    PrintLanguage::pushVnLHS(&this->super_PrintLanguage,pVVar2,op);
  }
  PcodeOp::push(op,&this->super_PrintLanguage);
  PrintLanguage::recurse(&this->super_PrintLanguage);
  return;
}

Assistant:

void PrintC::emitExpression(const PcodeOp *op)
   
{
  const Varnode *outvn = op->getOut();
  if (outvn != (Varnode *)0) {
    if (option_inplace_ops && emitInplaceOp(op)) return;
    pushOp(&assignment,op);
    pushVnLHS(outvn,op);
  }
  else if (op->doesSpecialPrinting()) {
    // Printing of constructor syntax
    const PcodeOp *newop = op->getIn(1)->getDef();
    outvn = newop->getOut();
    pushOp(&assignment,newop);
    pushVnLHS(outvn,newop);
    opConstructor(op,true);
    recurse();
    return;
  }
    // If STORE, print  *( ) = ( )
    // If BRANCH, print nothing
    // If CBRANCH, print condition  ( )
    // If BRANCHIND, print switch( )
    // If CALL, CALLIND, CALLOTHER  print  call
    // If RETURN,   print return ( )
  op->push(this);
  recurse();
}